

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::trainType::display(trainType *this,timeType *date)

{
  int day_id;
  int iVar1;
  ostream *poVar2;
  
  day_id = timeType::dateminus(date,this->saleDate);
  if (-1 < day_id) {
    iVar1 = timeType::dateminus(this->saleDate + 1,this->saleDate);
    if (day_id <= iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,this->trainID);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = std::operator<<(poVar2,this->type);
      std::endl<char,std::char_traits<char>>(poVar2);
      display_single(this,day_id,date,0,this->stationNum);
      return;
    }
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,-1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void display(timeType date)
		{
			int day_id = timeType::dateminus(date , saleDate[0]);
			if (day_id < 0 || day_id > timeType::dateminus(saleDate[1] , saleDate[0])) std::cout << -1 << std::endl;
			else
			{
				std::cout << trainID << " " << type << std::endl;
				display_single(day_id , date , 0 , stationNum);
			}
		}